

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.hpp
# Opt level: O0

int __thiscall
cinatra::http_parser::parse_request(http_parser *this,char *data,size_t size,int last_len)

{
  string_view mthd;
  string_view str;
  bool bVar1;
  int iVar2;
  http_method hVar3;
  pointer pvVar4;
  size_type __len;
  int in_ECX;
  size_t in_RDX;
  bool *unaff_RBX;
  bool *__pos;
  http_parser *in_RSI;
  bool *in_RDI;
  http_parser *this_00;
  http_parser *unaff_R12;
  size_t unaff_R13;
  char *unaff_R14;
  size_type __n;
  size_t pos;
  http_method methd_type;
  bool has_query;
  size_t url_len;
  char *url;
  size_t method_len;
  char *method;
  int minor_version;
  undefined1 *puVar5;
  char __c;
  basic_string_view<char,_std::char_traits<char>_> *this_01;
  size_t local_d8;
  size_t *in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff38 [16];
  char **in_stack_ffffffffffffff48;
  size_t in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  basic_string_view<char,_std::char_traits<char>_> local_98;
  basic_string_view<char,_std::char_traits<char>_> local_88;
  undefined1 local_71 [17];
  int *in_stack_ffffffffffffffa0;
  http_header *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  http_parser *has_connection;
  bool *has_close;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  in_RDI[0x18] = true;
  in_RDI[0x19] = false;
  in_RDI[0x1a] = false;
  in_RDI[0x1b] = false;
  in_RDI[0x1c] = false;
  in_RDI[0x1d] = false;
  in_RDI[0x1e] = false;
  in_RDI[0x1f] = false;
  local_71[0] = 0;
  has_connection = in_RSI;
  has_close = in_RDI;
  pvVar4 = std::array<cinatra::http_header,_100UL>::data
                     ((array<cinatra::http_header,_100UL> *)0x3a0d9f);
  __n = (size_type)in_ECX;
  __pos = in_RDI + 0x30;
  this_00 = (http_parser *)(in_RDI + 0x31);
  __c = (char)((ulong)(in_RDI + 0x32) >> 0x38);
  puVar5 = &stack0xffffffffffffffb0;
  this_01 = (basic_string_view<char,_std::char_traits<char>_> *)local_71;
  iVar2 = cinatra::detail::phr_parse_request
                    (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                     in_stack_ffffffffffffff38._8_8_,in_stack_ffffffffffffff38._0_8_,
                     in_stack_ffffffffffffff30,in_stack_ffffffffffffffa0,in_stack_ffffffffffffffa8,
                     (size_t *)CONCAT44(in_ECX,in_stack_ffffffffffffffb0),in_RDX,
                     (bool *)has_connection,has_close,
                     (bool *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),unaff_RBX
                    );
  *(int *)(in_RDI + 0x20) = iVar2;
  if (*(int *)(in_RDI + 0x20) < 0) {
    null_logger_t::operator<<((null_logger_t *)&NULL_LOGGER,(char (*) [23])"parse http head failed")
    ;
    if (*(long *)(in_RDI + 0x18) == 100) {
      output_error(this_00);
    }
    iVar2 = *(int *)(in_RDI + 0x20);
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_88,(char *)in_stack_ffffffffffffffa8,(size_type)in_stack_ffffffffffffffa0);
    *(size_t *)(in_RDI + 0xcb8) = local_88._M_len;
    *(char **)(in_RDI + 0xcc0) = local_88._M_str;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_98,(char *)local_71._9_8_,local_71._1_8_);
    *(size_t *)(in_RDI + 0xcc8) = local_98._M_len;
    *(char **)(in_RDI + 0xcd0) = local_98._M_str;
    mthd._M_str = (char *)pvVar4;
    mthd._M_len = (size_t)puVar5;
    hVar3 = method_type(mthd);
    if ((hVar3 == GET) || (hVar3 == HEAD)) {
      in_RDI[0x28] = false;
      in_RDI[0x29] = false;
      in_RDI[0x2a] = false;
      in_RDI[0x2b] = false;
      in_RDI[0x2c] = false;
      in_RDI[0x2d] = false;
      in_RDI[0x2e] = false;
      in_RDI[0x2f] = false;
    }
    else {
      parse_body_len(in_RSI);
    }
    *(undefined8 *)(in_RDI + 0xcd8) = *(undefined8 *)(in_RDI + 0xcc8);
    *(undefined8 *)(in_RDI + 0xce0) = *(undefined8 *)(in_RDI + 0xcd0);
    bVar1 = std::
            unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
            ::empty((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                     *)0x3a0f8f);
    if (!bVar1) {
      std::
      unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
      ::clear((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
               *)0x3a0fa4);
    }
    if ((local_71[0] & 1) != 0) {
      __len = std::basic_string_view<char,_std::char_traits<char>_>::find
                        (this_01,__c,(size_type)this_00);
      std::basic_string_view<char,_std::char_traits<char>_>::substr
                ((basic_string_view<char,_std::char_traits<char>_> *)this_00,(size_type)__pos,__n);
      str._M_str = unaff_R14;
      str._M_len = unaff_R13;
      parse_query(unaff_R12,str);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&local_d8,
                 (char *)local_71._9_8_,__len);
      *(size_t *)(in_RDI + 0xcc8) = local_d8;
      *(size_t **)(in_RDI + 0xcd0) = in_stack_ffffffffffffff30;
    }
    iVar2 = *(int *)(in_RDI + 0x20);
  }
  return iVar2;
}

Assistant:

int parse_request(const char *data, size_t size, int last_len) {
    int minor_version;

    num_headers_ = CINATRA_MAX_HTTP_HEADER_FIELD_SIZE;

    const char *method;
    size_t method_len;
    const char *url;
    size_t url_len;

    bool has_query{};
    header_len_ = detail::phr_parse_request(
        data, size, &method, &method_len, &url, &url_len, &minor_version,
        headers_.data(), &num_headers_, last_len, has_connection_, has_close_,
        has_upgrade_, has_query);

    if (header_len_ < 0) [[unlikely]] {
      CINATRA_LOG_WARNING << "parse http head failed";
      if (num_headers_ == CINATRA_MAX_HTTP_HEADER_FIELD_SIZE) {
        output_error();
      }
      return header_len_;
    }

    method_ = {method, method_len};
    url_ = {url, url_len};

    auto methd_type = method_type(method_);
    if (methd_type == http_method::GET || methd_type == http_method::HEAD) {
      body_len_ = 0;
    }
    else {
      parse_body_len();
    }

    full_url_ = url_;
    if (!queries_.empty()) {
      queries_.clear();
    }
    if (has_query) {
      size_t pos = url_.find('?');
      parse_query(url_.substr(pos + 1, url_len - pos - 1));
      url_ = {url, pos};
    }

    return header_len_;
  }